

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

void __thiscall QRhiSwapChain::QRhiSwapChain(QRhiSwapChain *this,QRhiImplementation *rhi)

{
  quint64 qVar1;
  
  (this->super_QRhiResource).m_rhi = rhi;
  (this->super_QRhiResource).m_objectName.d.d = (Data *)0x0;
  (this->super_QRhiResource).m_objectName.d.ptr = (char *)0x0;
  (this->super_QRhiResource).m_objectName.d.size = 0;
  LOCK();
  UNLOCK();
  qVar1 = (long)counter._q_value.super___atomic_base<unsigned_long_long>._M_i + 1;
  counter._q_value.super___atomic_base<unsigned_long_long>._M_i =
       (Type)(Type)((long)counter._q_value.super___atomic_base<unsigned_long_long>._M_i + 1);
  (this->super_QRhiResource).m_id = qVar1;
  (this->super_QRhiResource)._vptr_QRhiResource = (_func_int **)&PTR__QRhiResource_007db0a8;
  this->m_window = (QWindow *)0x0;
  this->m_flags = (QFlagsStorageHelper<QRhiSwapChain::Flag,_4>)0x0;
  this->m_format = SDR;
  this->m_depthStencil = (QRhiRenderBuffer *)0x0;
  this->m_sampleCount = 1;
  this->m_renderPassDesc = (QRhiRenderPassDescriptor *)0x0;
  (this->m_currentPixelSize).wd = -1;
  (this->m_currentPixelSize).ht = -1;
  (this->m_proxyData).reserved[0] = (void *)0x0;
  (this->m_proxyData).reserved[1] = (void *)0x0;
  this->m_shadingRateMap = (QRhiShadingRateMap *)0x0;
  return;
}

Assistant:

QRhiResource::QRhiResource(QRhiImplementation *rhi)
    : m_rhi(rhi)
{
    m_id = QRhiGlobalObjectIdGenerator::newId();
}